

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffer.cpp
# Opt level: O0

void __thiscall
char_buffer_stack_construction_Test::char_buffer_stack_construction_Test
          (char_buffer_stack_construction_Test *this)

{
  char_buffer_stack_construction_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__char_buffer_stack_construction_Test_00365460;
  return;
}

Assistant:

TEST(char_buffer, stack_construction)
{
    // If these change, this test may need to be updated to match
    ASSERT_EQ(16, ST_MAX_SSO_LENGTH);
    ASSERT_EQ(48, ST_MAX_SSO_SIZE);

    char empty[] = {0};
    wchar_t emptyw[] = {0};
    char16_t empty16[] = {0};
    char32_t empty32[] = {0};

    // Stack allocated
    char shortstr[] = "Short";
    wchar_t shortw[] = L"Short";
    char16_t short16[] = {'S', 'h', 'o', 'r', 't', 0};
    char32_t short32[] = {'S', 'h', 'o', 'r', 't', 0};

    // Heap allocated
    char longstr[] = "0123456789abcdefghij";
    wchar_t longw[] = L"0123456789abcdefghij";
    char16_t long16[] = {'0','1','2','3','4','5','6','7','8','9',
                         'a','b','c','d','e','f','g','h','i','j',0};
    char32_t long32[] = {'0','1','2','3','4','5','6','7','8','9',
                         'a','b','c','d','e','f','g','h','i','j',0};

    ST::char_buffer cb_empty(empty, 0);
    EXPECT_EQ(0, T_strcmp(cb_empty.data(), empty));
    EXPECT_EQ(0U, cb_empty.size());
    EXPECT_TRUE(cb_empty.empty());
    ST::wchar_buffer wcb_empty(emptyw, 0);
    EXPECT_EQ(0, T_strcmp(wcb_empty.data(), emptyw));
    EXPECT_EQ(0U, wcb_empty.size());
    EXPECT_TRUE(wcb_empty.empty());
    ST::utf16_buffer cb16_empty(empty16, 0);
    EXPECT_EQ(0, T_strcmp(cb16_empty.data(), empty16));
    EXPECT_EQ(0U, cb16_empty.size());
    EXPECT_TRUE(cb16_empty.empty());
    ST::utf32_buffer cb32_empty(empty32, 0);
    EXPECT_EQ(0, T_strcmp(cb32_empty.data(), empty32));
    EXPECT_EQ(0U, cb32_empty.size());
    EXPECT_TRUE(cb32_empty.empty());

    ST::char_buffer cb_short(shortstr, 5);
    EXPECT_EQ(0, T_strcmp(cb_short.data(), shortstr));
    EXPECT_EQ(5U, cb_short.size());
    EXPECT_FALSE(cb_short.empty());
    cb_short.clear();
    EXPECT_EQ(0, T_strcmp(cb_short.data(), empty));
    EXPECT_EQ(0U, cb_short.size());
    EXPECT_TRUE(cb_short.empty());

    ST::wchar_buffer wcb_short(shortw, 5);
    EXPECT_EQ(0, T_strcmp(wcb_short.data(), shortw));
    EXPECT_EQ(5U, wcb_short.size());
    EXPECT_FALSE(wcb_short.empty());
    wcb_short.clear();
    EXPECT_EQ(0, T_strcmp(wcb_short.data(), emptyw));
    EXPECT_EQ(0U, wcb_short.size());
    EXPECT_TRUE(wcb_short.empty());

    ST::utf16_buffer cb16_short(short16, 5);
    EXPECT_EQ(0, T_strcmp(cb16_short.data(), short16));
    EXPECT_EQ(5U, cb16_short.size());
    EXPECT_FALSE(cb16_short.empty());
    cb16_short.clear();
    EXPECT_EQ(0, T_strcmp(cb16_short.data(), empty16));
    EXPECT_EQ(0U, cb16_short.size());
    EXPECT_TRUE(cb16_short.empty());

    ST::utf32_buffer cb32_short(short32, 5);
    EXPECT_EQ(0, T_strcmp(cb32_short.data(), short32));
    EXPECT_EQ(5U, cb32_short.size());
    EXPECT_FALSE(cb32_short.empty());
    cb32_short.clear();
    EXPECT_EQ(0, T_strcmp(cb32_short.data(), empty32));
    EXPECT_EQ(0U, cb32_short.size());
    EXPECT_TRUE(cb32_short.empty());

    ST::char_buffer cb_long(longstr, 20);
    EXPECT_EQ(0, T_strcmp(cb_long.data(), longstr));
    EXPECT_EQ(20U, cb_long.size());
    EXPECT_FALSE(cb_long.empty());
    cb_long.clear();
    EXPECT_EQ(0, T_strcmp(cb_long.data(), empty));
    EXPECT_EQ(0U, cb_long.size());
    EXPECT_TRUE(cb_long.empty());

    ST::wchar_buffer wcb_long(longw, 20);
    EXPECT_EQ(0, T_strcmp(wcb_long.data(), longw));
    EXPECT_EQ(20U, wcb_long.size());
    EXPECT_FALSE(wcb_long.empty());
    wcb_long.clear();
    EXPECT_EQ(0, T_strcmp(wcb_long.data(), emptyw));
    EXPECT_EQ(0U, wcb_long.size());
    EXPECT_TRUE(wcb_long.empty());

    ST::utf16_buffer cb16_long(long16, 20);
    EXPECT_EQ(0, T_strcmp(cb16_long.data(), long16));
    EXPECT_EQ(20U, cb16_long.size());
    EXPECT_FALSE(cb16_long.empty());
    cb16_long.clear();
    EXPECT_EQ(0, T_strcmp(cb16_long.data(), empty16));
    EXPECT_EQ(0U, cb16_long.size());
    EXPECT_TRUE(cb16_long.empty());

    ST::utf32_buffer cb32_long(long32, 20);
    EXPECT_EQ(0, T_strcmp(cb32_long.data(), long32));
    EXPECT_EQ(20U, cb32_long.size());
    EXPECT_FALSE(cb32_long.empty());
    cb32_long.clear();
    EXPECT_EQ(0, T_strcmp(cb32_long.data(), empty32));
    EXPECT_EQ(0U, cb32_long.size());
    EXPECT_TRUE(cb32_long.empty());
}